

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscExpressions.cpp
# Opt level: O0

bool __thiscall
slang::ast::NamedValueExpression::checkConstant(NamedValueExpression *this,EvalContext *context)

{
  string_view arg;
  SourceRange range;
  SourceRange range_00;
  LookupLocation target;
  bool bVar1;
  EvalContext *this_00;
  Frame *pFVar2;
  Symbol *pSVar3;
  Diagnostic *this_01;
  Diagnostic *pDVar4;
  long in_RSI;
  Diagnostic *in_RDI;
  Diagnostic *diag_1;
  Scope *scope_1;
  optional<bool> compare;
  Diagnostic *diag;
  Scope *scope;
  SubroutineSymbol *subroutine;
  Frame *frame;
  bitmask<slang::ast::EvalFlags> *in_stack_fffffffffffffed8;
  Diagnostic *in_stack_fffffffffffffee0;
  SourceLocation in_stack_fffffffffffffee8;
  undefined8 in_stack_fffffffffffffef0;
  SubroutineSymbol *pSVar5;
  DiagCode noteCode;
  SourceLocation local_108;
  SourceLocation local_f0;
  EvalContext *in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  undefined4 in_stack_ffffffffffffff40;
  DiagCode in_stack_ffffffffffffff44;
  undefined8 in_stack_ffffffffffffff48;
  SourceLocation local_38;
  bitmask<slang::ast::EvalFlags> local_19 [24];
  bool local_1;
  
  noteCode = SUB84((ulong)in_stack_fffffffffffffef0 >> 0x20,0);
  this_00 = (EvalContext *)(in_RSI + 0x38);
  bitmask<slang::ast::EvalFlags>::bitmask(local_19,IsScript);
  bVar1 = bitmask<slang::ast::EvalFlags>::has
                    ((bitmask<slang::ast::EvalFlags> *)in_stack_fffffffffffffee0,
                     in_stack_fffffffffffffed8);
  if (bVar1) {
    local_1 = true;
  }
  else {
    bVar1 = ValueExpressionBase::checkConstantBase
                      ((ValueExpressionBase *)
                       CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                       in_stack_ffffffffffffff30);
    if (bVar1) {
      bVar1 = EvalContext::inFunction((EvalContext *)0xa1dfec);
      if (bVar1) {
        pFVar2 = EvalContext::topFrame((EvalContext *)0xa1e00a);
        pSVar5 = pFVar2->subroutine;
        if (pSVar5 == (SubroutineSymbol *)0x0) {
          local_1 = true;
        }
        else {
          if ((*(int *)&(((in_RDI->notes).
                          super__Vector_base<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>.
                          _M_impl.super__Vector_impl_data._M_start)->args).
                        super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
                        ._M_impl == 0x27) ||
             (*(int *)&(((in_RDI->notes).
                         super__Vector_base<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>.
                         _M_impl.super__Vector_impl_data._M_start)->args).
                       super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
                       ._M_impl == 0xb)) {
            target.scope._4_4_ = in_stack_ffffffffffffff44;
            target.scope._0_4_ = in_stack_ffffffffffffff40;
            target._8_8_ = in_stack_ffffffffffffff48;
            Symbol::isDeclaredBefore
                      ((Symbol *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                       target);
            bVar1 = std::optional<bool>::value_or<bool>
                              ((optional<bool> *)in_stack_fffffffffffffee8,
                               (bool *)in_stack_fffffffffffffee0);
            if ((((bVar1 ^ 0xffU) & 1) != 0) &&
               (((this_01 = (Diagnostic *)
                            Symbol::getParentScope
                                      ((Symbol *)
                                       (in_RDI->notes).
                                       super__Vector_base<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>
                                       ._M_impl.super__Vector_impl_data._M_start),
                 this_01 == (Diagnostic *)0x0 ||
                 (pSVar3 = Scope::asSymbol((Scope *)this_01), pSVar3->kind != Package)) ||
                (pDVar4 = (Diagnostic *)LookupLocation::getScope(&pFVar2->lookupLocation),
                in_stack_fffffffffffffee0 = this_01, this_01 == pDVar4)))) {
              range_00.endLoc._0_4_ = in_stack_ffffffffffffff38;
              range_00.startLoc = (SourceLocation)in_stack_ffffffffffffff30;
              range_00.endLoc._4_4_ = in_stack_ffffffffffffff3c;
              EvalContext::addDiag(this_00,in_stack_ffffffffffffff44,range_00);
              arg._M_str = (char *)in_stack_ffffffffffffff30;
              arg._M_len = (size_t)this_00;
              Diagnostic::operator<<(in_RDI,arg);
              Diagnostic::addNote(in_stack_fffffffffffffee0,noteCode,in_stack_fffffffffffffee8);
              return false;
            }
          }
          else {
            local_38 = (SourceLocation)
                       Symbol::getParentScope
                                 ((Symbol *)
                                  (in_RDI->notes).
                                  super__Vector_base<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
            while( true ) {
              bVar1 = false;
              if (local_38 != (SourceLocation)0x0) {
                local_f0 = (SourceLocation)0x0;
                if (pSVar5 != (SubroutineSymbol *)0x0) {
                  local_f0 = (SourceLocation)&pSVar5->super_Scope;
                }
                bVar1 = local_38 != local_f0;
              }
              if (!bVar1) break;
              pSVar3 = Scope::asSymbol((Scope *)local_38);
              local_38 = (SourceLocation)Symbol::getParentScope(pSVar3);
            }
            local_108 = (SourceLocation)0x0;
            if (pSVar5 != (SubroutineSymbol *)0x0) {
              local_108 = (SourceLocation)&pSVar5->super_Scope;
            }
            if (local_38 != local_108) {
              range.endLoc._0_4_ = in_stack_ffffffffffffff38;
              range.startLoc = (SourceLocation)in_stack_ffffffffffffff30;
              range.endLoc._4_4_ = in_stack_ffffffffffffff3c;
              EvalContext::addDiag(this_00,in_stack_ffffffffffffff44,range);
              Diagnostic::addNote(in_stack_fffffffffffffee0,SUB84((ulong)pSVar5 >> 0x20,0),local_38)
              ;
              return false;
            }
          }
          local_1 = true;
        }
      }
      else {
        local_1 = true;
      }
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool NamedValueExpression::checkConstant(EvalContext& context) const {
    if (context.flags.has(EvalFlags::IsScript))
        return true;

    if (!checkConstantBase(context))
        return false;

    if (!context.inFunction())
        return true;

    const EvalContext::Frame& frame = context.topFrame();
    const SubroutineSymbol* subroutine = frame.subroutine;
    if (!subroutine)
        return true;

    // Constant functions have a bunch of additional restrictions. See [13.4.4]:
    // - All parameter values used within the function shall be defined before the use of
    //   the invoking constant function call.
    // - All identifiers that are not parameters or functions shall be declared locally to
    //   the current function.
    if (symbol.kind != SymbolKind::Parameter && symbol.kind != SymbolKind::EnumValue) {
        const Scope* scope = symbol.getParentScope();
        while (scope && scope != subroutine)
            scope = scope->asSymbol().getParentScope();

        if (scope != subroutine) {
            auto& diag = context.addDiag(diag::ConstEvalFunctionIdentifiersMustBeLocal,
                                         sourceRange);
            diag.addNote(diag::NoteDeclarationHere, symbol.location);
            return false;
        }
    }
    else {
        // Check whether the referenced parameter is declared prior to the invocation
        // of the constant function. If the two locations are not in the same compilation
        // unit, assume that it's ok. Also if the reference is via a package import
        // that's fine too.
        auto compare = symbol.isDeclaredBefore(frame.lookupLocation);
        if (!compare.value_or(true)) {
            auto scope = symbol.getParentScope();
            if (!scope || scope->asSymbol().kind != SymbolKind::Package ||
                scope == frame.lookupLocation.getScope()) {

                auto& diag = context.addDiag(diag::ConstEvalIdUsedInCEBeforeDecl, sourceRange)
                             << symbol.name;
                diag.addNote(diag::NoteDeclarationHere, symbol.location);
                return false;
            }
        }
    }

    return true;
}